

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O0

void __thiscall FSDist_COF::FSDist_COF(FSDist_COF *this)

{
  undefined8 *in_RDI;
  FactoredStateDistribution *in_stack_ffffffffffffffc0;
  allocator_type *__a;
  undefined1 *__n;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffe0;
  undefined1 local_9 [9];
  
  FactoredStateDistribution::FactoredStateDistribution(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__FSDist_COF_00d4d120;
  in_RDI[1] = 0;
  __a = (allocator_type *)(in_RDI + 2);
  __n = local_9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb0754b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffe0,
             (size_type)__n,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb0756a);
  in_RDI[5] = 0;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0xb0758e);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(in_stack_ffffffffffffffe0,(size_type)__n,(allocator_type *)__a);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0xb075ac);
  return;
}

Assistant:

FSDist_COF::FSDist_COF() :
    _m_nrStateFactors(0),
    _m_sfacDomainSizes(0),
    _m_stepSize(0),
    _m_probs(0)
{
}